

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WeakReferenceDictionary.h
# Opt level: O3

bool __thiscall
JsUtil::
SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
::TryGetValueAndRemove
          (SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
           *this,TBKey *key,TBValue *value)

{
  uint uVar1;
  int *piVar2;
  ValueEntry<bool,_JsUtil::(anonymous_namespace)::ValueEntryData<bool>_> *pVVar3;
  TBKey pRVar4;
  hash_t targetBucket;
  uint i;
  uint last;
  
  piVar2 = (this->buckets).ptr;
  if (piVar2 != (int *)0x0) {
    targetBucket = PrimePolicy::ModPrime
                             ((uint)((ulong)*key >> 4) & 0x7fffffff,this->bucketCount,
                              this->modFunctionIndex);
    i = piVar2[targetBucket];
    if (-1 < (int)i) {
      pVVar3 = (this->entries).ptr;
      last = 0xffffffff;
      do {
        pRVar4 = (this->weakRefs).ptr[i].ptr;
        if (pRVar4 == (TBKey)0x0) {
          uVar1 = (this->entries).ptr[i].super_ValueEntryData<bool>.next;
          RemoveAt(this,i,last,targetBucket);
        }
        else {
          if (pRVar4 == *key) {
            *value = (this->entries).ptr[i].super_ValueEntryData<bool>.value;
            RemoveAt(this,i,last,targetBucket);
            return true;
          }
          uVar1 = pVVar3[i].super_ValueEntryData<bool>.next;
          last = i;
        }
        i = uVar1;
      } while (-1 < (int)i);
    }
  }
  return false;
}

Assistant:

bool TryGetValueAndRemove(const TBKey& key, TBValue* value)
        {
            int i, last;
            uint targetBucket;
            if (FindEntryWithKey(key, &i, &last, &targetBucket))
            {
                *value = this->GetValue(i);
                RemoveAt(i, last, targetBucket);
                return true;
            }
            return false;
        }